

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdAddPsbtTxOutWithScript
              (void *handle,void *psbt_handle,int64_t amount,char *locking_script,
              char *redeem_script,char *descriptor,uint32_t *index)

{
  NetType_conflict type;
  Psbt *this;
  Psbt *pPVar1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *pCVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_args;
  AddressFactory factory;
  Script script;
  Script redeem_script_obj;
  Script temp_script_1;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ref_list;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list_1;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  Script temp_script;
  Address addr;
  Script temp_wsh_script;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&addr,"PsbtHandle",(allocator *)&key_list);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 + 0x56;
    addr.witness_ver_ = 0x536;
    addr.address_._M_dataplus._M_p = "CfdAddPsbtTxOutWithScript";
    cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"psbt is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"Failed to handle statement. psbt is null.",(allocator *)&key_list);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&addr);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Script::Script(&script);
  cfd::core::Script::Script(&redeem_script_obj);
  bVar2 = cfd::capi::IsEmptyString(locking_script);
  if (!bVar2) {
    std::__cxx11::string::string((string *)&key_list,locking_script,(allocator *)&temp_script);
    cfd::core::Script::Script((Script *)&addr,(string *)&key_list);
    cfd::core::Script::operator=(&script,(Script *)&addr);
    cfd::core::Script::~Script((Script *)&addr);
    std::__cxx11::string::~string((string *)&key_list);
  }
  bVar2 = cfd::capi::IsEmptyString(redeem_script);
  if (!bVar2) {
    std::__cxx11::string::string((string *)&key_list,redeem_script,(allocator *)&temp_script);
    cfd::core::Script::Script((Script *)&addr,(string *)&key_list);
    cfd::core::Script::operator=(&redeem_script_obj,(Script *)&addr);
    cfd::core::Script::~Script((Script *)&addr);
    std::__cxx11::string::~string((string *)&key_list);
  }
  bVar2 = cfd::capi::IsEmptyString(descriptor);
  if (bVar2) {
    bVar2 = cfd::core::Script::IsEmpty(&redeem_script_obj);
    if (!bVar2) {
      bVar2 = cfd::core::Script::IsEmpty(&script);
      if (!bVar2) {
        cfd::AddressFactory::AddressFactory(&factory,*(NetType *)((long)psbt_handle + 0x10));
        cfd::core::Address::Address(&addr);
        bVar2 = cfd::core::Script::IsP2wshScript(&script);
        if (bVar2) {
          cfd::core::ScriptUtil::CreateP2wshLockingScript(&temp_script,&redeem_script_obj);
          bVar2 = cfd::core::Script::Equals(&temp_script,&script);
          if (!bVar2) {
            std::__cxx11::string::string
                      ((string *)&key_list,"locking_script is not match redeem_script.",
                       (allocator *)&temp_wsh_script);
            temp_wsh_script._vptr_Script = (_func_int **)0x4fd756;
            temp_wsh_script.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = 0x56d;
            temp_wsh_script.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = "CfdAddPsbtTxOutWithScript";
            cfd::core::logger::warn<std::__cxx11::string&>
                      ((CfdSourceLocation *)&temp_wsh_script,"{}",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &key_list);
            pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &temp_wsh_script,"Failed to parameter. ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &key_list);
            cfd::core::CfdException::CfdException
                      (pCVar4,kCfdIllegalArgumentError,(string *)&temp_wsh_script);
            __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,
                        cfd::core::CfdException::~CfdException);
          }
          cfd::AddressFactory::CreateP2wshAddress((Address *)&key_list,&factory,&redeem_script_obj);
          cfd::core::Address::operator=(&addr,(Address *)&key_list);
          cfd::core::Address::~Address((Address *)&key_list);
        }
        else {
          bVar2 = cfd::core::Script::IsP2shScript(&script);
          if (!bVar2) {
            std::__cxx11::string::string
                      ((string *)&key_list,"locking_script is not support format.",
                       (allocator *)&temp_script);
            temp_script._vptr_Script = (_func_int **)0x4fd756;
            temp_script.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = 0x589;
            temp_script.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = "CfdAddPsbtTxOutWithScript";
            cfd::core::logger::warn<std::__cxx11::string&>
                      ((CfdSourceLocation *)&temp_script,"{}",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &key_list);
            pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &temp_script,"Failed to parameter. ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &key_list);
            cfd::core::CfdException::CfdException
                      (pCVar4,kCfdIllegalArgumentError,(string *)&temp_script);
            __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,
                        cfd::core::CfdException::~CfdException);
          }
          cfd::core::ScriptUtil::CreateP2shLockingScript(&temp_script,&redeem_script_obj);
          cfd::core::ScriptUtil::CreateP2wshLockingScript(&temp_wsh_script,&redeem_script_obj);
          cfd::core::ScriptUtil::CreateP2shLockingScript(&temp_script_1,&temp_wsh_script);
          bVar2 = cfd::core::Script::Equals(&temp_script,&script);
          if (bVar2) {
            cfd::AddressFactory::CreateP2shAddress((Address *)&key_list,&factory,&redeem_script_obj)
            ;
            cfd::core::Address::operator=(&addr,(Address *)&key_list);
            cfd::core::Address::~Address((Address *)&key_list);
          }
          else {
            bVar2 = cfd::core::Script::Equals(&temp_script_1,&script);
            if (!bVar2) {
              std::__cxx11::string::string
                        ((string *)&key_list,"locking_script is not match redeem_script.",
                         (allocator *)&path_args);
              path_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4fd756;
              path_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(path_args.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x582);
              path_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_7cb8e8;
              cfd::core::logger::warn<std::__cxx11::string&>
                        ((CfdSourceLocation *)&path_args,"{}",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &key_list);
              pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &path_args,"Failed to parameter. ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &key_list);
              cfd::core::CfdException::CfdException
                        (pCVar4,kCfdIllegalArgumentError,(string *)&path_args);
              __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,
                          cfd::core::CfdException::~CfdException);
            }
            type = *(NetType_conflict *)((long)psbt_handle + 0x10);
            cfd::core::HashUtil::Hash160((ByteData160 *)&path_args,&temp_wsh_script);
            cfd::core::Address::Address
                      ((Address *)&key_list,type,kP2shP2wshAddress,(ByteData160 *)&path_args);
            cfd::core::Address::operator=(&addr,(Address *)&key_list);
            cfd::core::Address::~Address((Address *)&key_list);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&path_args);
          }
          cfd::core::Script::~Script(&temp_script_1);
          cfd::core::Script::~Script(&temp_wsh_script);
        }
        cfd::core::Script::~Script(&temp_script);
        key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pPVar1 = *(Psbt **)((long)psbt_handle + 0x18);
        cfd::core::Amount::Amount((Amount *)&temp_script,amount);
        uVar3 = cfd::Psbt::AddTxOutData
                          (pPVar1,(Amount *)&temp_script,&addr,&redeem_script_obj,&key_list);
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list);
        cfd::core::Address::~Address(&addr);
        cfd::AddressFactory::~AddressFactory(&factory);
        goto LAB_003885b0;
      }
    }
    bVar2 = cfd::core::Script::IsEmpty(&script);
    if (bVar2) {
      addr._0_8_ = (long)
                   "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   + 0x56;
      addr.witness_ver_ = 0x594;
      addr.address_._M_dataplus._M_p = "CfdAddPsbtTxOutWithScript";
      cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"locking_script is null or empty.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&addr,"Failed to parameter. locking_script is null or empty.",
                 (allocator *)&key_list);
      cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&addr);
      __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    this = *(Psbt **)((long)psbt_handle + 0x18);
    cfd::core::Amount::Amount((Amount *)&addr,amount);
    uVar3 = cfd::core::Psbt::AddTxOut(this,&script,(Amount *)&addr);
  }
  else {
    std::__cxx11::string::string((string *)&addr,descriptor,(allocator *)&key_list);
    cfd::core::Descriptor::Parse
              ((Descriptor *)&temp_wsh_script,(string *)&addr,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0);
    std::__cxx11::string::~string((string *)&addr);
    path_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    path_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    path_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cfd::core::Descriptor::GetKeyDataAll
              (&key_list_1,(Descriptor *)&temp_wsh_script,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    cfd::core::Descriptor::GetReferenceAll
              (&ref_list,(Descriptor *)&temp_wsh_script,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    cfd::core::Script::Script(&temp_script_1);
    cfd::core::Address::Address((Address *)&temp_script);
    cfd::core::DescriptorScriptReference::DescriptorScriptReference
              ((DescriptorScriptReference *)&addr,
               ref_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cfd::core::DescriptorScriptReference::GenerateAddress
              ((Address *)&key_list,(DescriptorScriptReference *)&addr,
               *(NetType *)((long)psbt_handle + 0x10));
    cfd::core::Address::operator=((Address *)&temp_script,(Address *)&key_list);
    cfd::core::Address::~Address((Address *)&key_list);
    while( true ) {
      bVar2 = cfd::core::DescriptorScriptReference::HasChild((DescriptorScriptReference *)&addr);
      if (!bVar2) break;
      bVar2 = cfd::core::DescriptorScriptReference::HasRedeemScript
                        ((DescriptorScriptReference *)&addr);
      if (bVar2) {
        cfd::core::DescriptorScriptReference::GetRedeemScript
                  ((Script *)&key_list,(DescriptorScriptReference *)&addr);
        cfd::core::Script::operator=(&temp_script_1,(Script *)&key_list);
        cfd::core::Script::~Script((Script *)&key_list);
      }
      cfd::core::DescriptorScriptReference::GetChild
                ((DescriptorScriptReference *)&key_list,(DescriptorScriptReference *)&addr);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)&addr,(DescriptorScriptReference *)&key_list);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference
                ((DescriptorScriptReference *)&key_list);
    }
    bVar2 = cfd::core::DescriptorScriptReference::HasRedeemScript
                      ((DescriptorScriptReference *)&addr);
    if (bVar2) {
      cfd::core::DescriptorScriptReference::GetRedeemScript
                ((Script *)&key_list,(DescriptorScriptReference *)&addr);
      cfd::core::Script::operator=(&temp_script_1,(Script *)&key_list);
      cfd::core::Script::~Script((Script *)&key_list);
    }
    bVar2 = cfd::core::Script::IsEmpty(&script);
    if (!bVar2) {
      cfd::core::DescriptorScriptReference::GetLockingScript
                ((Script *)&key_list,(DescriptorScriptReference *)&addr);
      bVar2 = cfd::core::Script::Equals(&script,(Script *)&key_list);
      cfd::core::Script::~Script((Script *)&key_list);
      if (!bVar2) {
        std::__cxx11::string::string
                  ((string *)&key_list,"locking_script doesn\'t match the descriptor.",
                   (allocator *)&factory);
        factory._vptr_AddressFactory = (_func_int **)0x4fd756;
        factory.type_ = 0x555;
        factory.prefix_list_.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7cb8e8;
        cfd::core::logger::warn<std::__cxx11::string&>
                  ((CfdSourceLocation *)&factory,"{}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key_list);
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&factory
                       ,"Failed to parameter. ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &key_list);
        cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&factory);
        __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
    }
    bVar2 = cfd::core::Script::IsEmpty(&redeem_script_obj);
    if (!bVar2) {
      bVar2 = cfd::core::Script::Equals(&redeem_script_obj,&temp_script_1);
      if (!bVar2) {
        std::__cxx11::string::string
                  ((string *)&key_list,"redeem_script doesn\'t match the descriptor.",
                   (allocator *)&factory);
        factory._vptr_AddressFactory = (_func_int **)0x4fd756;
        factory.type_ = 0x55d;
        factory.prefix_list_.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7cb8e8;
        cfd::core::logger::warn<std::__cxx11::string&>
                  ((CfdSourceLocation *)&factory,"{}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key_list);
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&factory
                       ,"Failed to parameter. ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &key_list);
        cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&factory);
        __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
    }
    pPVar1 = *(Psbt **)((long)psbt_handle + 0x18);
    cfd::core::Amount::Amount((Amount *)&key_list,amount);
    uVar3 = cfd::Psbt::AddTxOutData
                      (pPVar1,(Amount *)&key_list,(Address *)&temp_script,&temp_script_1,&key_list_1
                      );
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&addr);
    cfd::core::Address::~Address((Address *)&temp_script);
    cfd::core::Script::~Script(&temp_script_1);
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::~vector(&ref_list);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&path_args);
    cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)&temp_wsh_script);
  }
LAB_003885b0:
  if (index != (uint32_t *)0x0) {
    *index = uVar3;
  }
  cfd::core::Script::~Script(&redeem_script_obj);
  cfd::core::Script::~Script(&script);
  return 0;
}

Assistant:

int CfdAddPsbtTxOutWithScript(
    void* handle, void* psbt_handle, int64_t amount,
    const char* locking_script, const char* redeem_script,
    const char* descriptor, uint32_t* index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Script script;
    Script redeem_script_obj;
    uint32_t txout_index = 0;
    if (!IsEmptyString(locking_script)) script = Script(locking_script);
    if (!IsEmptyString(redeem_script)) {
      redeem_script_obj = Script(redeem_script);
    }

    if (!IsEmptyString(descriptor)) {
      Descriptor desc = Descriptor::Parse(descriptor);
      std::vector<std::string> path_args;
      auto key_list = desc.GetKeyDataAll();
      auto ref_list = desc.GetReferenceAll();
      Script temp_redeem_script;
      Address addr;
      auto ref = ref_list.front();
      addr = ref.GenerateAddress(psbt_obj->net_type);
      while (ref.HasChild()) {
        if (ref.HasRedeemScript()) temp_redeem_script = ref.GetRedeemScript();
        ref = ref.GetChild();
      }
      if (ref.HasRedeemScript()) temp_redeem_script = ref.GetRedeemScript();

      if ((!script.IsEmpty()) && (!script.Equals(ref.GetLockingScript()))) {
        std::string err_msg = "locking_script doesn't match the descriptor.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }
      if ((!redeem_script_obj.IsEmpty()) &&
          (!redeem_script_obj.Equals(temp_redeem_script))) {
        std::string err_msg = "redeem_script doesn't match the descriptor.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }

      txout_index = psbt_obj->psbt->AddTxOutData(
          Amount(amount), addr, temp_redeem_script, key_list);
    } else if ((!redeem_script_obj.IsEmpty()) && (!script.IsEmpty())) {
      AddressFactory factory(psbt_obj->net_type);
      Address addr;
      if (script.IsP2wshScript()) {
        auto temp_script =
            ScriptUtil::CreateP2wshLockingScript(redeem_script_obj);
        if (!temp_script.Equals(script)) {
          std::string err_msg = "locking_script is not match redeem_script.";
          warn(CFD_LOG_SOURCE, "{}", err_msg);
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to parameter. " + err_msg);
        }
        addr = factory.CreateP2wshAddress(redeem_script_obj);
      } else if (script.IsP2shScript()) {
        auto temp_sh_script =
            ScriptUtil::CreateP2shLockingScript(redeem_script_obj);
        auto temp_wsh_script =
            ScriptUtil::CreateP2wshLockingScript(redeem_script_obj);
        auto temp_script =
            ScriptUtil::CreateP2shLockingScript(temp_wsh_script);
        if (temp_sh_script.Equals(script)) {
          addr = factory.CreateP2shAddress(redeem_script_obj);
        } else if (temp_script.Equals(script)) {
          addr = Address(
              psbt_obj->net_type, AddressType::kP2shP2wshAddress,
              HashUtil::Hash160(temp_wsh_script));
        } else {
          std::string err_msg = "locking_script is not match redeem_script.";
          warn(CFD_LOG_SOURCE, "{}", err_msg);
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to parameter. " + err_msg);
        }
      } else {
        std::string err_msg = "locking_script is not support format.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }
      std::vector<KeyData> key_list;
      txout_index = psbt_obj->psbt->AddTxOutData(
          Amount(amount), addr, redeem_script_obj, key_list);
    } else if (!script.IsEmpty()) {
      txout_index = psbt_obj->psbt->AddTxOut(script, Amount(amount));
    } else {
      warn(CFD_LOG_SOURCE, "locking_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. locking_script is null or empty.");
    }

    if (index != nullptr) *index = txout_index;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}